

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

void duckdb::MergeUpdateLoop<unsigned_long>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UnifiedVectorFormat *in_RCX;
  unsigned_long *update_vector_data;
  unsigned_long *base_table_data;
  row_t *in_stack_00006128;
  unsigned_long *in_stack_00006130;
  SelectionVector *in_stack_00006138;
  UpdateInfo *in_stack_00006140;
  unsigned_long *in_stack_00006148;
  UpdateInfo *in_stack_00006150;
  idx_t in_stack_00006160;
  SelectionVector *in_stack_00006168;
  
  FlatVector::GetData<unsigned_long>((Vector *)0xbc46d1);
  UnifiedVectorFormat::GetData<unsigned_long>(in_RCX);
  MergeUpdateLoopInternal<unsigned_long,unsigned_long,duckdb::ExtractStandardEntry>
            (in_stack_00006150,in_stack_00006148,in_stack_00006140,in_stack_00006138,
             in_stack_00006130,in_stack_00006128,in_stack_00006160,in_stack_00006168);
  return;
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}